

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void dataDeviceHandleDrop(void *userData,wl_data_device *device)

{
  char *text;
  char **paths;
  int i;
  long lVar1;
  int count;
  int local_1c;
  
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    text = readDataOfferAsString(_glfw.wl.dragOffer,"text/uri-list");
    if (text != (char *)0x0) {
      paths = _glfwParseUriList(text,&local_1c);
      if (paths != (char **)0x0) {
        _glfwInputDrop(_glfw.wl.dragFocus,local_1c,paths);
      }
      for (lVar1 = 0; lVar1 < local_1c; lVar1 = lVar1 + 1) {
        _glfw_free(paths[lVar1]);
      }
      _glfw_free(paths);
    }
    _glfw_free(text);
  }
  return;
}

Assistant:

static void dataDeviceHandleDrop(void* userData,
                                 struct wl_data_device* device)
{
    if (!_glfw.wl.dragOffer)
        return;

    char* string = readDataOfferAsString(_glfw.wl.dragOffer, "text/uri-list");
    if (string)
    {
        int count;
        char** paths = _glfwParseUriList(string, &count);
        if (paths)
            _glfwInputDrop(_glfw.wl.dragFocus, count, (const char**) paths);

        for (int i = 0; i < count; i++)
            _glfw_free(paths[i]);

        _glfw_free(paths);
    }

    _glfw_free(string);
}